

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void multi_thread_test(size_t ndocs,size_t wal_threshold,size_t time_sec,size_t nbatch,
                      size_t compact_term,size_t nwriters,size_t nreaders)

{
  int iVar1;
  pthread_t pVar2;
  fdb_kvs_handle *pfVar3;
  list *__th;
  fdb_doc *doc;
  size_t keylen;
  fdb_iterator *pfVar4;
  double dVar5;
  fdb_kvs_config *pfVar6;
  fdb_status fVar7;
  int iVar8;
  ulong uVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  fdb_config *fconfig_00;
  fdb_config *fconfig_01;
  fdb_kvs_handle *pfVar14;
  fdb_doc *pfVar15;
  pthread_t *ppVar16;
  void **ppvVar17;
  fdb_kvs_config *pfVar18;
  fdb_kvs_config *pfVar19;
  void *pvVar20;
  void *pvVar21;
  fdb_kvs_config *pfVar22;
  fdb_custom_cmp_variable *pp_Var23;
  fdb_kvs_config *pfVar24;
  fdb_custom_cmp_variable *pp_Var25;
  fdb_custom_cmp_variable *pp_Var26;
  fdb_custom_cmp_variable *pp_Var27;
  fdb_custom_cmp_variable *pp_Var28;
  fdb_custom_cmp_variable *pp_Var29;
  fdb_custom_cmp_variable *pp_Var30;
  fdb_custom_cmp_variable *pp_Var31;
  char *pcVar32;
  fdb_file_handle *pfVar33;
  void **ppvVar34;
  pthread_t *__newthread;
  uint uVar35;
  code *pcVar36;
  void **__arg;
  fdb_config *unaff_R15;
  long lVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  fdb_kvs_config fStack_1cf0;
  fdb_kvs_config afStack_1cd8 [6];
  void *apvStack_1c38 [17];
  fdb_custom_cmp_variable p_Stack_1bb0;
  void *pvStack_1ba8;
  fdb_kvs_config afStack_1ba0 [17];
  undefined1 auStack_1a00 [47];
  undefined1 auStack_19d1 [201];
  void *apvStack_1908 [32];
  fdb_custom_cmp_variable ap_Stack_1808 [10];
  void *apvStack_17b8 [32];
  fdb_kvs_handle *apfStack_16b8 [20];
  fdb_kvs_config afStack_1618 [10];
  void *pvStack_1518;
  fdb_kvs_config afStack_1510 [10];
  timeval tStack_1418;
  fdb_kvs_config fStack_1408;
  undefined1 auStack_13e8 [24];
  fdb_custom_cmp_variable p_Stack_13d0;
  void *pvStack_13c8;
  fdb_kvs_config fStack_13c0;
  fdb_custom_cmp_variable p_Stack_13a0;
  void *pvStack_1398;
  fdb_kvs_config fStack_1390;
  fdb_config fStack_1378;
  timeval tStack_1280;
  fdb_kvs_config fStack_1270;
  fdb_custom_cmp_variable p_Stack_1250;
  void *pvStack_1248;
  fdb_kvs_config fStack_1240;
  undefined1 local_1228 [8];
  char keybuf [1024];
  char metabuf [1024];
  char bodybuf [1024];
  char temp [1024];
  fdb_config fconfig;
  fdb_kvs_info kvs_info;
  timeval __test_begin;
  timeval ts_cur;
  fdb_kvs_config kvs_config;
  timeval ts_begin;
  undefined4 local_68;
  pthread_spinlock_t local_64;
  int n_opened;
  pthread_spinlock_t filename_count_lock;
  fdb_file_handle *local_58;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  long local_40;
  uint local_34 [2];
  int filename_count;
  
  fStack_1240.custom_cmp_param = (void *)0x1135bb;
  _n_opened = (void *)time_sec;
  gettimeofday((timeval *)&kvs_info.file,(__timezone_ptr_t)0x0);
  local_40 = nreaders + nwriters;
  pvVar20 = (void *)(long)(int)local_40;
  uVar9 = (long)pvVar20 * 8 + 0xfU & 0xfffffffffffffff0;
  ppVar16 = (pthread_t *)((long)local_1228 - uVar9);
  ppvVar17 = (void **)((long)ppVar16 - uVar9);
  ppvVar34 = ppvVar17 + (long)pvVar20 * -0xe;
  pfVar18 = (fdb_kvs_config *)((long)ppvVar34 - (ndocs * 8 + 0xf & 0xfffffffffffffff0));
  local_34[0] = 1;
  local_68 = 0;
  *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x11364b;
  pfVar19 = pfVar18;
  db = (fdb_kvs_handle *)ndocs;
  pthread_spin_init(&local_64,1);
  *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113657;
  system("rm -rf  dummy* > errorlog.txt");
  *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113666;
  fdb_get_default_config();
  fconfig_01 = (fdb_config *)&ts_cur.tv_usec;
  *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113675;
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0x100;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113693;
  memleak_start();
  *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x11369f;
  puts("Initialize..");
  *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x1136ba;
  sprintf(bodybuf + 0x3f8,"dummy%d",(ulong)local_34[0]);
  *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x1136cc;
  fdb_open(&local_58,bodybuf + 0x3f8,(fdb_config *)(temp + 0x3f8));
  *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x1136de;
  fdb_kvs_open_default(local_58,(fdb_kvs_handle **)&dbfile,(fdb_kvs_config *)fconfig_01);
  *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x1136f4;
  pfVar33 = dbfile;
  fVar7 = fdb_set_log_callback((fdb_kvs_handle *)dbfile,logCallbackFunc,"multi_thread_test");
  if (fVar7 == FDB_RESULT_SUCCESS) {
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x11370a;
    gettimeofday((timeval *)&kvs_config.custom_cmp_param,(__timezone_ptr_t)0x0);
    if (db != (fdb_kvs_handle *)0x0) {
      uVar9 = 0;
      pfVar19 = pfVar18;
      do {
        pcVar32 = bodybuf + 0x3f8;
        *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113730;
        _set_random_string_smallabt(pcVar32,0x5c);
        *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x11374e;
        sprintf(local_1228,"k%07d%s",uVar9 & 0xffffffff,pcVar32);
        *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113766;
        sprintf(keybuf + 0x3f8,"m%07d",uVar9 & 0xffffffff);
        *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113773;
        _set_random_string_smallabt(pcVar32,0x55);
        *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113790;
        sprintf(metabuf + 0x3f8,"b%07d%07d%s",uVar9 & 0xffffffff,0,pcVar32);
        *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113798;
        sVar10 = strlen(local_1228);
        *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x1137aa;
        sVar11 = strlen(keybuf + 0x3f8);
        *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x1137b9;
        sVar12 = strlen(metabuf + 0x3f8);
        *(size_t *)((long)(pfVar18 + 0xffffffffffffffff) + 8) = sVar12;
        *(undefined8 *)(pfVar18 + 0xffffffffffffffff) = 0x1137dd;
        fdb_doc_create((fdb_doc **)pfVar19,local_1228,sVar10,keybuf + 0x3f8,sVar11,metabuf + 0x3f8,
                       *(size_t *)((long)(pfVar18 + 0xffffffffffffffff) + 8));
        pfVar15 = *(fdb_doc **)pfVar19;
        *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x1137ed;
        fdb_set((fdb_kvs_handle *)dbfile,pfVar15);
        uVar9 = uVar9 + 1;
        pfVar19 = (fdb_kvs_config *)&pfVar19->custom_cmp;
      } while (db != (fdb_kvs_handle *)uVar9);
    }
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x11380c;
    fdb_commit(local_58,'\x01');
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x11381d;
    gettimeofday((timeval *)&__test_begin.tv_usec,(__timezone_ptr_t)0x0);
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113837;
    _utime_gap(stack0xffffffffffffff38,stack0xffffffffffffff10);
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113840;
    fdb_kvs_close((fdb_kvs_handle *)dbfile);
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113849;
    fdb_close(local_58);
    if (0 < (int)(uint)local_40) {
      uVar35 = (uint)local_40 & 0x7fffffff;
      uVar9 = 0;
      __newthread = ppVar16;
      __arg = ppvVar34;
      do {
        *(int *)__arg = (int)uVar9;
        __arg[1] = pvVar20;
        __arg[3] = (void *)(ulong)(uVar9 < nwriters);
        __arg[2] = db;
        __arg[4] = pfVar18;
        __arg[5] = _n_opened;
        __arg[6] = (void *)nbatch;
        __arg[7] = (void *)compact_term;
        __arg[8] = &local_68;
        __arg[9] = local_34;
        __arg[10] = &local_64;
        __arg[0xc] = temp + 0x3f8;
        __arg[0xd] = &ts_cur.tv_usec;
        *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113906;
        pthread_create(__newthread,(pthread_attr_t *)0x0,_worker_thread,__arg);
        uVar9 = uVar9 + 1;
        __newthread = __newthread + 1;
        __arg = __arg + 0xe;
      } while (uVar35 != uVar9);
    }
    pfVar14 = db;
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113964;
    printf("wait for %d seconds..\n",(ulong)_n_opened & 0xffffffff);
    if (0 < (int)(uint)local_40) {
      uVar35 = (uint)local_40 & 0x7fffffff;
      uVar9 = 0;
      do {
        pVar2 = ppVar16[uVar9];
        *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x11398f;
        pthread_join(pVar2,ppvVar17);
        uVar9 = uVar9 + 1;
        ppvVar17 = ppvVar17 + 1;
      } while (uVar35 != uVar9);
    }
    if (pfVar14 != (fdb_kvs_handle *)0x0) {
      lVar37 = 0;
      do {
        pfVar15 = *(fdb_doc **)((long)&pfVar18->create_if_missing + lVar37 * 8);
        *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x1139af;
        fdb_doc_free(pfVar15);
        lVar37 = lVar37 + 1;
      } while (pfVar14 != (fdb_kvs_handle *)lVar37);
    }
    if ((int)(uint)local_40 < 1) {
      dVar5 = 0.0;
      lVar37 = 0;
    }
    else {
      uVar9 = (ulong)((uint)local_40 & 0x7fffffff);
      ppvVar34 = ppvVar34 + 0xb;
      lVar37 = 0;
      lVar13 = 0;
      do {
        pvVar21 = *ppvVar34;
        pvVar20 = (void *)0x0;
        if (ppvVar34[-8] == (void *)0x0) {
          pvVar21 = (void *)0x0;
          pvVar20 = *ppvVar34;
        }
        lVar13 = lVar13 + (long)pvVar20;
        lVar37 = lVar37 + (long)pvVar21;
        ppvVar34 = ppvVar34 + 0xe;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
      auVar40._8_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar40._0_8_ = lVar13;
      auVar40._12_4_ = 0x45300000;
      dVar5 = (auVar40._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0);
    }
    auVar41._0_8_ = (double)CONCAT44(0x43300000,(int)_n_opened);
    auVar41._8_4_ = (int)((ulong)_n_opened >> 0x20);
    auVar41._12_4_ = 0x45300000;
    dVar43 = (auVar41._8_8_ - 1.9342813113834067e+25) + (auVar41._0_8_ - 4503599627370496.0);
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113a59;
    printf("read: %.1f ops/sec\n",SUB84(dVar5 / dVar43,0));
    auVar42._8_4_ = (int)((ulong)lVar37 >> 0x20);
    auVar42._0_8_ = lVar37;
    auVar42._12_4_ = 0x45300000;
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113a8d;
    printf("write: %.1f ops/sec\n",
           SUB84(((auVar42._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar37) - 4503599627370496.0)) / dVar43,0));
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113aa8;
    sprintf(bodybuf + 0x3f8,"dummy%d",(ulong)local_34[0]);
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113abe;
    fdb_open(&local_58,bodybuf + 0x3f8,(fdb_config *)(temp + 0x3f8));
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113ad4;
    fdb_kvs_open_default(local_58,(fdb_kvs_handle **)&dbfile,(fdb_kvs_config *)&ts_cur.tv_usec);
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113ae6;
    fdb_get_kvs_info((fdb_kvs_handle *)dbfile,(fdb_kvs_info *)&fconfig.num_blocks_readahead);
    if ((bool *)kvs_info.name != &(pfVar14->kvs_config).create_if_missing + lVar37) {
      *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113afe;
      multi_thread_test();
    }
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113b07;
    fdb_kvs_close((fdb_kvs_handle *)dbfile);
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113b10;
    fdb_close(local_58);
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113b15;
    fdb_shutdown();
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113b1a;
    memleak_end();
    pcVar32 = "%s PASSED\n";
    if (multi_thread_test(unsigned_long,unsigned_long,unsigned_long,unsigned_long,unsigned_long,unsigned_long,unsigned_long)
        ::__test_pass != '\0') {
      pcVar32 = "%s FAILED\n";
    }
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = 0x113b4b;
    fprintf(_stderr,pcVar32,"multi thread test");
    return;
  }
  *(code **)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = multi_thread_client_shutdown;
  multi_thread_test();
  *(undefined1 **)((long)(pfVar18 + 0xffffffffffffffff) + 0x10) = &stack0xfffffffffffffff8;
  *(fdb_config **)((long)(pfVar18 + 0xffffffffffffffff) + 8) = unaff_R15;
  *(fdb_file_handle ***)(pfVar18 + 0xffffffffffffffff) = &local_58;
  *(fdb_config **)((long)(pfVar18 + 0xfffffffffffffffe) + 0x10) = (fdb_config *)(temp + 0x3f8);
  *(fdb_config **)((long)(pfVar18 + 0xfffffffffffffffe) + 8) = fconfig_01;
  *(fdb_file_handle ***)(pfVar18 + 0xfffffffffffffffe) = &dbfile;
  pcVar36 = (code *)0x0;
  *(undefined8 *)((long)(pfVar18 + 0xfffffffffffffff1) + 8) = 0x113b84;
  gettimeofday((timeval *)((long)(pfVar18 + 0xfffffffffffffffc) + 8),(__timezone_ptr_t)0x0);
  if (pfVar33 == (fdb_file_handle *)0x0) {
    *(undefined8 *)((long)(pfVar18 + 0xfffffffffffffff1) + 8) = 0x113b92;
    memleak_start();
    *(undefined8 *)((long)(pfVar18 + 0xfffffffffffffff1) + 8) = 0x113b9e;
    system("rm -rf  dummy* > errorlog.txt");
    *(undefined4 *)(pfVar18 + 0xfffffffffffffff2) = 0;
    do {
      *(undefined8 *)(pfVar18 + 0xfffffffffffffff0) = 0x113bda;
      pthread_create((pthread_t *)((long)(pfVar18 + 0xfffffffffffffff1) + (long)(int)pcVar36 * 8U),
                     (pthread_attr_t *)0x0,multi_thread_client_shutdown,pfVar18 + 0xfffffffffffffff2
                    );
      iVar8 = *(int *)(pfVar18 + 0xfffffffffffffff2);
      uVar35 = iVar8 + 1;
      pcVar36 = (code *)(ulong)uVar35;
      *(uint *)(pfVar18 + 0xfffffffffffffff2) = uVar35;
    } while (iVar8 < 1);
    *(undefined4 *)(pfVar18 + 0xfffffffffffffff2) = 0;
    iVar8 = 0;
    do {
      pVar2 = *(pthread_t *)((long)(pfVar18 + 0xfffffffffffffff1) + (long)iVar8 * 8U);
      *(undefined8 *)(pfVar18 + 0xfffffffffffffff0) = 0x113c0a;
      pthread_join(pVar2,(void **)((long)pfVar18 + ((long)iVar8 + -0x2f) * 8));
      iVar1 = *(int *)(pfVar18 + 0xfffffffffffffff2);
      iVar8 = iVar1 + 1;
      *(int *)(pfVar18 + 0xfffffffffffffff2) = iVar8;
    } while (iVar1 < 1);
    *(undefined8 *)(pfVar18 + 0xfffffffffffffff0) = 0x113c22;
    memleak_end();
    pcVar32 = "%s PASSED\n";
    if (multi_thread_client_shutdown(void*)::__test_pass != '\0') {
      pcVar32 = "%s FAILED\n";
    }
    *(undefined8 *)(pfVar18 + 0xfffffffffffffff0) = 0x113c53;
    fprintf(_stderr,pcVar32,"multi thread client shutdown");
    return;
  }
  *(undefined8 *)((long)(pfVar18 + 0xfffffffffffffff1) + 8) = 0x113c73;
  fdb_get_default_config();
  *(undefined8 *)((long)(pfVar18 + 0xfffffffffffffff1) + 8) = 0x113c7c;
  fdb_get_default_kvs_config();
  *(void **)((long)(pfVar18 + 0xfffffffffffffff2) + 0x10) = (void *)0x400;
  *(undefined1 *)((long)(pfVar18 + 0xfffffffffffffff3) + 0x17) = 0;
  pfVar22 = pfVar18 + 0xfffffffffffffffd;
  *(undefined8 *)((long)(pfVar18 + 0xfffffffffffffff1) + 8) = 0x113c9b;
  fVar7 = fdb_open((fdb_file_handle **)pfVar22,"./dummy1",
                   (fdb_config *)(pfVar18 + 0xfffffffffffffff2));
  if (fVar7 == FDB_RESULT_SUCCESS) {
    pfVar33 = *(fdb_file_handle **)(pfVar18 + 0xfffffffffffffffd);
    *(undefined8 *)((long)(pfVar18 + 0xfffffffffffffff1) + 8) = 0x113ca8;
    fVar7 = fdb_close(pfVar33);
    if (fVar7 != FDB_RESULT_SUCCESS) {
      *(undefined8 *)((long)(pfVar18 + 0xfffffffffffffff1) + 8) = 0x113cb5;
      multi_thread_client_shutdown();
    }
    *(undefined8 *)((long)(pfVar18 + 0xfffffffffffffff1) + 8) = 0x113cba;
    fdb_shutdown();
    *(undefined8 *)((long)(pfVar18 + 0xfffffffffffffff1) + 8) = 0x113cc1;
    pthread_exit((void *)0x0);
  }
  *(code **)((long)(pfVar18 + 0xfffffffffffffff1) + 8) = multi_thread_kvs_client;
  multi_thread_client_shutdown();
  pp_Var25 = (fdb_custom_cmp_variable *)((long)(pfVar18 + 0xfffffffffffffff1) + 8);
  pp_Var26 = (fdb_custom_cmp_variable *)((long)(pfVar18 + 0xfffffffffffffff1) + 8);
  pp_Var27 = (fdb_custom_cmp_variable *)((long)(pfVar18 + 0xfffffffffffffff1) + 8);
  pp_Var28 = (fdb_custom_cmp_variable *)((long)(pfVar18 + 0xfffffffffffffff1) + 8);
  pp_Var29 = (fdb_custom_cmp_variable *)((long)(pfVar18 + 0xfffffffffffffff1) + 8);
  pp_Var30 = (fdb_custom_cmp_variable *)((long)(pfVar18 + 0xfffffffffffffff1) + 8);
  pp_Var31 = (fdb_custom_cmp_variable *)((long)(pfVar18 + 0xfffffffffffffff1) + 8);
  *(void ***)((long)(pfVar18 + 0xfffffffffffffff1) + 8) =
       (void **)((long)(pfVar18 + 0xffffffffffffffff) + 0x10);
  *(fdb_config **)(pfVar18 + 0xfffffffffffffff1) = unaff_R15;
  *(fdb_file_handle ***)((long)(pfVar18 + 0xfffffffffffffff0) + 0x10) = &local_58;
  *(undefined8 *)((long)(pfVar18 + 0xfffffffffffffff0) + 8) = 0;
  *(fdb_config **)(pfVar18 + 0xfffffffffffffff0) = fconfig_01;
  *(fdb_config **)((long)(pfVar18 + 0xffffffffffffffef) + 0x10) =
       (fdb_config *)(pfVar18 + 0xfffffffffffffff2);
  pp_Var23 = (fdb_custom_cmp_variable *)((long)(pfVar18 + 0xffffffffffffff9b) + 8);
  pfVar24 = (fdb_kvs_config *)((long)(pfVar18 + 0xffffffffffffff9b) + 8);
  *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113ceb;
  gettimeofday((timeval *)((long)(pfVar18 + 0xffffffffffffffeb) + 8),(__timezone_ptr_t)0x0);
  *(fdb_custom_cmp_variable *)((long)(pfVar18 + 0xffffffffffffffef) + 8) =
       (fdb_custom_cmp_variable)0x0;
  if (pfVar22 != (fdb_kvs_config *)0x0) {
    fconfig_00 = (fdb_config *)(pfVar18 + 0xffffffffffffffd6);
    *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113d0b;
    fdb_get_default_config();
    unaff_R15 = (fdb_config *)((long)(pfVar18 + 0xffffffffffffffac) + 8);
    *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113d22;
    memcpy(unaff_R15,fconfig_00,0xf8);
    pfVar14 = (fdb_kvs_handle *)(pfVar18 + 0xffffffffffffffef);
    *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113d35;
    fVar7 = fdb_open((fdb_file_handle **)pfVar14,"./dummy1",unaff_R15);
    pfVar6 = (fdb_kvs_config *)((long)(pfVar18 + 0xffffffffffffff9b) + 8);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00114281;
    uVar35 = *(uint *)pfVar22;
    pfVar22 = pfVar18 + 0xffffffffffffffd6;
    *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113d57;
    sprintf(&pfVar22->create_if_missing,"db%d",(ulong)uVar35);
    fconfig_00 = (fdb_config *)((long)(pfVar18 + 0xffffffffffffffe0) + 0x10);
    *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113d66;
    fdb_get_default_kvs_config();
    pfVar19 = (fdb_kvs_config *)((long)(pfVar18 + 0xffffffffffffffed) + 8);
    *(fdb_custom_cmp_variable *)(pfVar18 + 0xffffffffffffffee) =
         *(fdb_custom_cmp_variable *)((long)(pfVar18 + 0xffffffffffffffe1) + 8);
    pvVar20 = *(void **)(pfVar18 + 0xffffffffffffffe1);
    *(void **)pfVar19 = *(void **)fconfig_00;
    *(void **)((long)(pfVar18 + 0xffffffffffffffed) + 0x10) = pvVar20;
    pfVar14 = *(fdb_kvs_handle **)(pfVar18 + 0xffffffffffffffef);
    *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113d89;
    fVar7 = fdb_kvs_open((fdb_file_handle *)pfVar14,
                         (fdb_kvs_handle **)(pfVar18 + 0xffffffffffffffec),
                         &pfVar22->create_if_missing,pfVar19);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00114286;
    pfVar22 = (fdb_kvs_config *)0x0;
    unaff_R15 = (fdb_config *)0x0;
    do {
      *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113db1;
      sprintf((char *)((long)(pfVar18 + 0xffffffffffffffe0) + 0x10U),"key%d",
              (ulong)unaff_R15 & 0xffffffff);
      *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113dcc;
      sprintf((char *)((long)(pfVar18 + 0xffffffffffffffb6) + 0x10U),"meta%d",
              (ulong)unaff_R15 & 0xffffffff);
      *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113de4;
      sprintf((char *)((long)(pfVar18 + 0xffffffffffffffc4) + 0x10),"body%d",
              (ulong)unaff_R15 & 0xffffffff);
      pcVar36 = (code *)((long)pfVar22 + (long)pfVar18 + -0x970);
      *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113df7;
      fconfig_00 = (fdb_config *)strlen((char *)((long)(pfVar18 + 0xffffffffffffffe0) + 0x10U));
      *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113e02;
      fconfig_01 = (fdb_config *)strlen((char *)((long)(pfVar18 + 0xffffffffffffffb6) + 0x10U));
      *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113e11;
      sVar10 = strlen((char *)((long)(pfVar18 + 0xffffffffffffffc4) + 0x10));
      pfVar19 = (fdb_kvs_config *)((long)(pfVar18 + 0xffffffffffffffb6) + 0x10);
      *(size_t *)((long)(pfVar18 + 0xffffffffffffff9a) + 0x10) = sVar10;
      *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff9a) + 8) = 0x113e39;
      fdb_doc_create((fdb_doc **)pcVar36,(void **)((long)(pfVar18 + 0xffffffffffffffe0) + 0x10),
                     (size_t)fconfig_00,pfVar19,(size_t)fconfig_01,
                     (void **)((long)(pfVar18 + 0xffffffffffffffc4) + 0x10),
                     *(size_t *)((long)(pfVar18 + 0xffffffffffffff9a) + 0x10));
      pfVar14 = *(fdb_kvs_handle **)(pfVar18 + 0xffffffffffffffec);
      pfVar15 = *(fdb_doc **)
                 ((long)&pfVar18->custom_cmp_param +
                 ((long)(unaff_R15 + 0xfffffffffffffffe) + 0xc0U) * 8U);
      *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113e4e;
      fVar7 = fdb_set(pfVar14,pfVar15);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00114263;
      pfVar15 = *(fdb_doc **)
                 ((long)&pfVar18->custom_cmp_param +
                 ((long)(unaff_R15 + 0xfffffffffffffffe) + 0xc0U) * 8U);
      *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113e63;
      fdb_doc_free(pfVar15);
      unaff_R15 = (fdb_config *)((long)&unaff_R15->chunksize + 1);
      pfVar22 = (fdb_kvs_config *)&pfVar22->custom_cmp;
    } while (unaff_R15 != (fdb_config *)0x32);
    pfVar14 = *(fdb_kvs_handle **)(pfVar18 + 0xffffffffffffffef);
    *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113e82;
    fVar7 = fdb_commit((fdb_file_handle *)pfVar14,'\x01');
    pfVar24 = (fdb_kvs_config *)((long)(pfVar18 + 0xffffffffffffff9b) + 8);
    if (fVar7 == FDB_RESULT_SUCCESS) {
      *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113e93;
      fdb_close(*(fdb_file_handle **)(pfVar18 + 0xffffffffffffffef));
      return;
    }
    goto LAB_00114290;
  }
  *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113ea9;
  memleak_start();
  *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113eb5;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar22 = pfVar18 + 0xffffffffffffffd6;
  *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113ec4;
  fdb_get_default_config();
  fconfig_00 = (fdb_config *)((long)(pfVar18 + 0xffffffffffffffac) + 8);
  *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113edb;
  memcpy(fconfig_00,pfVar22,0xf8);
  *(void **)((long)(pfVar18 + 0xffffffffffffffac) + 0x10) = (void *)0x0;
  *(undefined8 *)(pfVar18 + 0xffffffffffffffad) = 0x400;
  *(undefined1 *)((long)(pfVar18 + 0xffffffffffffffae) + 7) = 0;
  pfVar14 = (fdb_kvs_handle *)(pfVar18 + 0xffffffffffffffef);
  *(undefined8 *)(pfVar18 + 0xffffffffffffff9b) = 0x113f03;
  fVar7 = fdb_open((fdb_file_handle **)pfVar14,"./dummy1",fconfig_00);
  pfVar24 = (fdb_kvs_config *)((long)(pfVar18 + 0xffffffffffffff9b) + 8);
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011428b;
  *(void ***)((long)(pfVar18 + 0xffffffffffffffee) + 0x10) =
       (void **)((long)(pfVar18 + 0xffffffffffffff94) + 0x10);
  pfVar24 = pfVar18 + 0xffffffffffffff8e;
  fconfig_00 = (fdb_config *)(pfVar18 + 0xffffffffffffffd6);
  pfVar22 = (fdb_kvs_config *)((long)(pfVar18 + 0xffffffffffffffed) + 8);
  unaff_R15 = (fdb_config *)0x0;
  pcVar36 = (code *)0x0;
  do {
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x113f4d;
    sprintf((char *)fconfig_00,"db%d",(ulong)pcVar36 & 0xffffffff);
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x113f59;
    fdb_get_default_kvs_config();
    *(fdb_custom_cmp_variable *)(pfVar18 + 0xffffffffffffffee) =
         *(fdb_custom_cmp_variable *)((long)(pfVar18 + 0xffffffffffffffe1) + 8);
    pvVar20 = *(void **)(pfVar18 + 0xffffffffffffffe1);
    *(fdb_custom_cmp_variable *)((long)(pfVar18 + 0xffffffffffffffed) + 8) =
         *(fdb_custom_cmp_variable *)((long)(pfVar18 + 0xffffffffffffffe0) + 0x10);
    *(void **)((long)(pfVar18 + 0xffffffffffffffed) + 0x10) = pvVar20;
    pfVar14 = *(fdb_kvs_handle **)(pfVar18 + 0xffffffffffffffef);
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x113f89;
    pfVar19 = pfVar22;
    fVar7 = fdb_kvs_open((fdb_file_handle *)pfVar14,
                         (fdb_kvs_handle **)
                         ((long)((long)(pfVar18 + 0xffffffffffffffcf) + 8U) + (long)unaff_R15),
                         (char *)fconfig_00,pfVar22);
    fconfig_01 = (fdb_config *)pfVar24;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011426d;
    pfVar14 = *(fdb_kvs_handle **)((long)pfVar18 + ((long)pcVar36 + -0x92) * 8);
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x113f9e;
    fVar7 = fdb_kvs_close(pfVar14);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00114268;
    pcVar36 = (code *)((long)pcVar36 + 1);
    unaff_R15 = (fdb_config *)&unaff_R15->buffercache_size;
  } while ((void **)pcVar36 != (void **)0x14);
  pfVar22 = (fdb_kvs_config *)((long)(pfVar18 + 0xffffffffffffffc1) + 8);
  lVar37 = 0;
  unaff_R15 = *(fdb_config **)((long)(pfVar18 + 0xffffffffffffffee) + 0x10);
  do {
    *(int *)pfVar22 = (int)lVar37;
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x113fdb;
    pfVar19 = pfVar22;
    pthread_create((pthread_t *)unaff_R15,(pthread_attr_t *)0x0,multi_thread_kvs_client,pfVar22);
    lVar37 = lVar37 + 1;
    unaff_R15 = (fdb_config *)((long)unaff_R15 + 8);
    pfVar22 = (fdb_kvs_config *)&pfVar22->field_0x4;
  } while (lVar37 != 0x14);
  lVar37 = 0;
  fconfig_00 = *(fdb_config **)((long)(pfVar18 + 0xffffffffffffffee) + 0x10);
  do {
    pVar2 = *(pthread_t *)((long)&fconfig_00->chunksize + lVar37);
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x113fff;
    pthread_join(pVar2,(void **)((long)&pfVar24->create_if_missing + lVar37));
    lVar37 = lVar37 + 8;
  } while (lVar37 != 0xa0);
  pfVar14 = *(fdb_kvs_handle **)(pfVar18 + 0xffffffffffffffef);
  *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x114017;
  fVar7 = fdb_commit((fdb_file_handle *)pfVar14,'\0');
  pcVar36 = (code *)0x14;
  pfVar22 = (fdb_kvs_config *)0xa0;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00114295;
  pcVar36 = (code *)((long)(pfVar18 + 0xffffffffffffffb6) + 0x10);
  pfVar22 = (fdb_kvs_config *)((long)(pfVar18 + 0xffffffffffffffc4) + 0x10);
  uVar9 = 0;
  do {
    unaff_R15 = (fdb_config *)((long)(pfVar18 + 0xffffffffffffffe0) + 0x10);
    fconfig_01 = (fdb_config *)(pfVar18 + 0xffffffffffffffd6);
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x114052;
    sprintf((char *)fconfig_01,"db%d",uVar9 & 0xffffffff);
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x11405b;
    fdb_get_default_kvs_config();
    *(void **)(pfVar18 + 0xffffffffffffffee) =
         *(void **)((long)(pfVar18 + 0xffffffffffffffec) + 0x10);
    *(fdb_custom_cmp_variable *)((long)(pfVar18 + 0xffffffffffffffed) + 8) =
         *(fdb_custom_cmp_variable *)(pfVar18 + 0xffffffffffffffec);
    *(fdb_custom_cmp_variable *)((long)(pfVar18 + 0xffffffffffffffed) + 0x10) =
         *(fdb_custom_cmp_variable *)((long)(pfVar18 + 0xffffffffffffffec) + 8);
    pfVar14 = *(fdb_kvs_handle **)(pfVar18 + 0xffffffffffffffef);
    *(ulong *)(pfVar18 + 0xffffffffffffffed) = uVar9;
    fconfig_00 = (fdb_config *)((long)pfVar18 + (uVar9 + 0xffffffffffffff6e) * 8);
    pfVar19 = (fdb_kvs_config *)((long)(pfVar18 + 0xffffffffffffffed) + 8);
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x11408a;
    fVar7 = fdb_kvs_open((fdb_file_handle *)pfVar14,(fdb_kvs_handle **)fconfig_00,(char *)fconfig_01
                         ,pfVar19);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00114272;
    pfVar14 = *(fdb_kvs_handle **)fconfig_00;
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x11409e;
    fVar7 = fdb_get_kvs_seqnum(pfVar14,(fdb_seqnum_t *)((long)(pfVar18 + 0xffffffffffffffee) + 8));
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00114277;
    if (*(fdb_custom_cmp_variable *)((long)(pfVar18 + 0xffffffffffffffee) + 8) !=
        (fdb_custom_cmp_variable)0x32) {
      *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x11420c;
      multi_thread_kvs_client();
    }
    fconfig_01 = (fdb_config *)0x0;
    *(fdb_config **)((long)(pfVar18 + 0xffffffffffffffee) + 0x10) = fconfig_00;
    do {
      unaff_R15 = (fdb_config *)((long)(pfVar18 + 0xffffffffffffffe0) + 0x10);
      *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x1140cc;
      sprintf((char *)unaff_R15,"key%d",fconfig_01);
      *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x1140e0;
      sprintf((char *)pcVar36,"meta%d",fconfig_01);
      *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x1140f4;
      sprintf((char *)pfVar22,"body%d",fconfig_01);
      *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x1140fc;
      sVar10 = strlen((char *)unaff_R15);
      pfVar19 = (fdb_kvs_config *)0x0;
      *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 8) = 0;
      *(undefined8 *)(pfVar18 + 0xffffffffffffff8d) = 0x114119;
      fdb_doc_create((fdb_doc **)((long)(pfVar18 + 0xffffffffffffffef) + 8),unaff_R15,sVar10,
                     (void *)0x0,0,(void *)0x0,*(size_t *)((long)(pfVar18 + 0xffffffffffffff8d) + 8)
                    );
      pfVar14 = *(fdb_kvs_handle **)fconfig_00;
      pfVar15 = *(fdb_doc **)((long)(pfVar18 + 0xffffffffffffffef) + 8);
      *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x114129;
      fVar7 = fdb_get(pfVar14,pfVar15);
      if (fVar7 != FDB_RESULT_SUCCESS) {
        *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x114263;
        multi_thread_kvs_client();
        goto LAB_00114263;
      }
      pvVar20 = *(void **)(*(fdb_custom_cmp_variable *)((long)(pfVar18 + 0xffffffffffffffef) + 8) +
                          0x20);
      *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x114147;
      sVar10 = strlen((char *)unaff_R15);
      *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x114155;
      iVar8 = bcmp(pvVar20,unaff_R15,sVar10);
      if (iVar8 != 0) {
        *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x1141c2;
        multi_thread_kvs_client();
      }
      sVar10 = *(size_t *)
                (*(fdb_custom_cmp_variable *)((long)(pfVar18 + 0xffffffffffffffef) + 8) + 8);
      pvVar20 = *(void **)(*(fdb_custom_cmp_variable *)((long)(pfVar18 + 0xffffffffffffffef) + 8) +
                          0x38);
      *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x114170;
      iVar8 = bcmp(pvVar20,pcVar36,sVar10);
      if (iVar8 != 0) {
        *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x1141d0;
        multi_thread_kvs_client();
      }
      sVar10 = *(size_t *)
                (*(fdb_custom_cmp_variable *)((long)(pfVar18 + 0xffffffffffffffef) + 8) + 0x10);
      pvVar20 = *(void **)(*(fdb_custom_cmp_variable *)((long)(pfVar18 + 0xffffffffffffffef) + 8) +
                          0x40);
      *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x11418b;
      iVar8 = bcmp(pvVar20,pfVar22,sVar10);
      if (iVar8 != 0) {
        *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x1141de;
        multi_thread_kvs_client();
      }
      pfVar15 = *(fdb_doc **)((long)(pfVar18 + 0xffffffffffffffef) + 8);
      *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x114198;
      fdb_doc_free(pfVar15);
      uVar35 = (int)fconfig_01 + 1;
      fconfig_01 = (fdb_config *)(ulong)uVar35;
      fconfig_00 = *(fdb_config **)((long)(pfVar18 + 0xffffffffffffffee) + 0x10);
      unaff_R15 = (fdb_config *)((long)(pfVar18 + 0xffffffffffffffe0) + 0x10);
    } while (uVar35 != 0x32);
    pfVar14 = *(fdb_kvs_handle **)fconfig_00;
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x1141e8;
    fVar7 = fdb_kvs_close(pfVar14);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011427c;
    uVar9 = *(long *)(pfVar18 + 0xffffffffffffffed) + 1;
  } while (uVar9 != 0x14);
  pfVar14 = *(fdb_kvs_handle **)(pfVar18 + 0xffffffffffffffef);
  *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x11421a;
  fVar7 = fdb_close((fdb_file_handle *)pfVar14);
  fconfig_00 = (fdb_config *)0x14;
  if (fVar7 == FDB_RESULT_SUCCESS) {
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x114223;
    fdb_shutdown();
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x114228;
    memleak_end();
    if (multi_thread_kvs_client(void*)::__test_pass == '\0') {
      pcVar32 = "%s PASSED\n";
    }
    else {
      pcVar32 = "%s FAILED\n";
    }
    *(undefined8 *)((long)(pfVar18 + 0xffffffffffffff8d) + 0x10) = 0x114259;
    fprintf(_stderr,pcVar32,"multi thread kvs client");
    return;
  }
  goto LAB_0011429a;
LAB_0011468c:
  *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114691;
  multi_thread_fhandle_share();
LAB_00114691:
  *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114696;
  multi_thread_fhandle_share();
LAB_00114696:
  *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x11469b;
  multi_thread_fhandle_share();
LAB_0011469b:
  ppvVar17 = (void **)((long)(pfVar24 + 0xfffffffffffffff1) + 0x10);
  pcVar32 = "key%03d";
  *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x1146a0;
  multi_thread_fhandle_share();
  goto LAB_001146a0;
LAB_00114d80:
  *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114d85;
  custom_compare_primitive_test();
LAB_00114d85:
  *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114d8a;
  custom_compare_primitive_test();
LAB_00114d8a:
  *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114d8f;
  custom_compare_primitive_test();
  goto LAB_00114d8f;
LAB_00114263:
  *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffff) + 0x10) = 0x114268;
  multi_thread_kvs_client();
LAB_00114268:
  *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffff) + 0x10) = 0x11426d;
  multi_thread_kvs_client();
LAB_0011426d:
  *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffff) + 0x10) = 0x114272;
  multi_thread_kvs_client();
LAB_00114272:
  *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffff) + 0x10) = 0x114277;
  multi_thread_kvs_client();
LAB_00114277:
  *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffff) + 0x10) = 0x11427c;
  multi_thread_kvs_client();
LAB_0011427c:
  *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffff) + 0x10) = 0x114281;
  multi_thread_kvs_client();
  pfVar6 = pfVar24;
LAB_00114281:
  pp_Var23 = (fdb_custom_cmp_variable *)pfVar6;
  *(undefined8 *)((long)pp_Var23 + -8) = 0x114286;
  multi_thread_kvs_client();
LAB_00114286:
  *(undefined8 *)((long)pp_Var23 + -8) = 0x11428b;
  multi_thread_kvs_client();
  pfVar24 = (fdb_kvs_config *)pp_Var23;
LAB_0011428b:
  *(undefined8 *)((long)pfVar24 + -8) = 0x114290;
  multi_thread_kvs_client();
LAB_00114290:
  *(undefined8 *)((long)pfVar24 + -8) = 0x114295;
  multi_thread_kvs_client();
LAB_00114295:
  *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffff) + 0x10) = 0x11429a;
  multi_thread_kvs_client();
LAB_0011429a:
  *(code **)((long)(pfVar24 + 0xffffffffffffffff) + 0x10) = multi_thread_fhandle_share;
  multi_thread_kvs_client();
  *(fdb_custom_cmp_variable **)((long)(pfVar24 + 0xffffffffffffffff) + 0x10) =
       (fdb_custom_cmp_variable *)((long)(pfVar18 + 0xfffffffffffffff1) + 8);
  *(fdb_config **)((long)(pfVar24 + 0xffffffffffffffff) + 8) = unaff_R15;
  *(fdb_config **)(pfVar24 + 0xffffffffffffffff) = fconfig_00;
  *(code **)((long)(pfVar24 + 0xfffffffffffffffe) + 0x10) = pcVar36;
  *(fdb_config **)((long)(pfVar24 + 0xfffffffffffffffe) + 8) = fconfig_01;
  *(fdb_kvs_config **)(pfVar24 + 0xfffffffffffffffe) = pfVar22;
  *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x1142bf;
  gettimeofday((timeval *)(pfVar24 + 0xfffffffffffffff3),(__timezone_ptr_t)0x0);
  if (pfVar14 != (fdb_kvs_handle *)0x0) {
    if (*(char *)&pfVar14->op_stats == '\0') {
      if (((ulong)pfVar14->op_stats & 0x100) == 0) {
        ppvVar17 = (void **)((long)(pfVar24 + 0xfffffffffffffff1) + 0x10);
        fconfig_01 = (fdb_config *)((long)(pfVar24 + 0xfffffffffffffff3) + 0x10);
        pcVar36 = (code *)((long)(pfVar24 + 0xfffffffffffffff0) + 0x10);
        pp_Var25 = (fdb_custom_cmp_variable *)0x0;
        do {
          *(void **)((long)(pfVar24 + 0xfffffffffffffff3) + 0x10) = (void *)0x0;
          *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x1143ad;
          sprintf((char *)ppvVar17,"key%03d",pp_Var25);
          pfVar3 = (fdb_kvs_handle *)(pfVar14->kvs_config).custom_cmp_param;
          *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x1143c4;
          pfVar19 = (fdb_kvs_config *)fconfig_01;
          fVar7 = fdb_get_kv(pfVar3,ppvVar17,7,(void **)fconfig_01,(size_t *)pcVar36);
          if (fVar7 == FDB_RESULT_HANDLE_BUSY) {
            *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114682;
            multi_thread_fhandle_share();
LAB_00114682:
            *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114687;
            multi_thread_fhandle_share();
LAB_00114687:
            *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x11468c;
            multi_thread_fhandle_share();
            goto LAB_0011468c;
          }
          pfVar3 = (fdb_kvs_handle *)pfVar14->kvs;
          *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x1143e4;
          pfVar19 = (fdb_kvs_config *)fconfig_01;
          fVar7 = fdb_get_kv(pfVar3,ppvVar17,7,(void **)fconfig_01,(size_t *)pcVar36);
          if (fVar7 == FDB_RESULT_HANDLE_BUSY) goto LAB_00114682;
          pfVar3 = (fdb_kvs_handle *)(pfVar14->kvs_config).custom_cmp;
          *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114404;
          pfVar19 = (fdb_kvs_config *)fconfig_01;
          fVar7 = fdb_get_kv(pfVar3,ppvVar17,7,(void **)fconfig_01,(size_t *)pcVar36);
          if (fVar7 == FDB_RESULT_HANDLE_BUSY) goto LAB_00114687;
          uVar35 = (int)pp_Var25 + 1;
          pp_Var25 = (fdb_custom_cmp_variable *)(ulong)uVar35;
        } while ((uVar35 != 2000) ||
                (pp_Var25 = (fdb_custom_cmp_variable *)0x0, ((ulong)pfVar14->op_stats & 0x100) == 0)
                );
      }
    }
    else {
      ppvVar17 = (void **)((long)(pfVar24 + 0xfffffffffffffff1) + 0x10);
      pp_Var25 = (fdb_custom_cmp_variable *)0x0;
      do {
        *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x1142ef;
        sprintf((char *)ppvVar17,"key%03d",pp_Var25);
        pfVar3 = (fdb_kvs_handle *)(pfVar14->kvs_config).custom_cmp_param;
        pfVar19 = (fdb_kvs_config *)0x0;
        *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114305;
        fVar7 = fdb_set_kv(pfVar3,ppvVar17,7,(void *)0x0,0);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011469b;
        pfVar3 = (fdb_kvs_handle *)pfVar14->kvs;
        pfVar19 = (fdb_kvs_config *)0x0;
        *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114323;
        fVar7 = fdb_set_kv(pfVar3,ppvVar17,7,(void *)0x0,0);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00114696;
        pfVar3 = (fdb_kvs_handle *)(pfVar14->kvs_config).custom_cmp;
        pfVar19 = (fdb_kvs_config *)0x0;
        *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114341;
        fVar7 = fdb_set_kv(pfVar3,ppvVar17,7,(void *)0x0,0);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00114691;
        pfVar3 = *(fdb_kvs_handle **)&pfVar14->kvs_config;
        *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114356;
        fVar7 = fdb_commit((fdb_file_handle *)pfVar3,'\x01');
        if (fVar7 == FDB_RESULT_HANDLE_BUSY) goto LAB_0011468c;
        uVar35 = (int)pp_Var25 + 1;
        pp_Var25 = (fdb_custom_cmp_variable *)(ulong)uVar35;
      } while (uVar35 != 2000);
    }
    return;
  }
  *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x11443a;
  pfVar14 = (fdb_kvs_handle *)malloc(0x10);
  *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114447;
  pcVar32 = (char *)malloc(0x50);
  *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114454;
  ppvVar17 = (void **)malloc(0x10);
  *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114463;
  system("rm -rf  func_test* > errorlog.txt");
  fconfig_01 = (fdb_config *)((long)(pfVar24 + 0xfffffffffffffff3) + 0x10);
  *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114470;
  fdb_get_default_config();
  *(undefined8 *)(pfVar24 + 0xfffffffffffffff4) = 0;
  *(undefined1 *)((long)(pfVar24 + 0xfffffffffffffff5) + 0xf) = 0;
  *(void **)((long)(pfVar24 + 0xfffffffffffffff8) + 0x10) = (void *)0x1;
  *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114492;
  fdb_get_default_kvs_config();
  pcVar36 = (code *)((long)(pfVar24 + 0xfffffffffffffff1) + 0x10);
  *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x1144aa;
  sprintf((char *)pcVar36,"./func_test_pt.%d",0);
  *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x1144b8;
  fVar7 = fdb_open((fdb_file_handle **)((long)(pfVar24 + 0xfffffffffffffff0) + 8),(char *)pcVar36,
                   fconfig_01);
  if (fVar7 == FDB_RESULT_SUCCESS) {
    pfVar33 = *(fdb_file_handle **)((long)(pfVar24 + 0xfffffffffffffff0) + 8);
    *(fdb_file_handle **)pcVar32 = pfVar33;
    *(fdb_file_handle **)(pcVar32 + 0x28) = pfVar33;
    pcVar32[0x20] = '\x01';
    pcVar32[0x48] = '\0';
    *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x1144e3;
    fVar7 = fdb_kvs_open_default
                      (pfVar33,(fdb_kvs_handle **)(pcVar32 + 0x30),
                       (fdb_kvs_config *)((long)(pfVar24 + 0xfffffffffffffff0) + 0x10));
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001146a5;
    pfVar33 = *(fdb_file_handle **)((long)(pfVar24 + 0xfffffffffffffff0) + 8);
    pfVar19 = (fdb_kvs_config *)((long)(pfVar24 + 0xfffffffffffffff0) + 0x10);
    *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114504;
    fVar7 = fdb_kvs_open(pfVar33,(fdb_kvs_handle **)(pcVar32 + 0x38),"main",pfVar19);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001146aa;
    pfVar33 = *(fdb_file_handle **)((long)(pfVar24 + 0xfffffffffffffff0) + 8);
    pfVar19 = (fdb_kvs_config *)((long)(pfVar24 + 0xfffffffffffffff0) + 0x10);
    *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114525;
    fVar7 = fdb_kvs_open(pfVar33,(fdb_kvs_handle **)(pcVar32 + 0x40),"back",pfVar19);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001146af;
    pfVar33 = *(fdb_file_handle **)((long)(pfVar24 + 0xfffffffffffffff0) + 8);
    *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x11453f;
    fVar7 = fdb_kvs_open_default
                      (pfVar33,(fdb_kvs_handle **)(pcVar32 + 8),
                       (fdb_kvs_config *)((long)(pfVar24 + 0xfffffffffffffff0) + 0x10));
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001146b4;
    pfVar33 = *(fdb_file_handle **)((long)(pfVar24 + 0xfffffffffffffff0) + 8);
    pfVar19 = (fdb_kvs_config *)((long)(pfVar24 + 0xfffffffffffffff0) + 0x10);
    *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114560;
    fVar7 = fdb_kvs_open(pfVar33,(fdb_kvs_handle **)(pcVar32 + 0x10),"main",pfVar19);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001146b9;
    pfVar33 = *(fdb_file_handle **)((long)(pfVar24 + 0xfffffffffffffff0) + 8);
    pfVar19 = (fdb_kvs_config *)((long)(pfVar24 + 0xfffffffffffffff0) + 0x10);
    *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114581;
    fVar7 = fdb_kvs_open(pfVar33,(fdb_kvs_handle **)(pcVar32 + 0x18),"back",pfVar19);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001146be;
    *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x1145a1;
    printf("Creating %d writers+readers over %d docs..\n",1,2000);
    fconfig_01 = (fdb_config *)(pcVar32 + 0x28);
    lVar37 = 8;
    pcVar36 = multi_thread_fhandle_share;
    do {
      LOCK();
      *(undefined1 *)((long)fconfig_01 + 0x18U + 9) = 0;
      UNLOCK();
      *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x1145cc;
      pfVar19 = (fdb_kvs_config *)fconfig_01;
      pthread_create((pthread_t *)((long)&(pfVar14->kvs_config).create_if_missing + lVar37),
                     (pthread_attr_t *)0x0,multi_thread_fhandle_share,fconfig_01);
      lVar37 = lVar37 + -8;
      fconfig_01 = (fdb_config *)((long)fconfig_01 + 0xffffffffffffffd0U + 8);
    } while (lVar37 != -8);
    pfVar3 = *(fdb_kvs_handle **)&pfVar14->kvs_config;
    *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x1145e5;
    pthread_join((pthread_t)pfVar3,ppvVar17);
    *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x1145f5;
    printf("Writer %d done\n",0);
    LOCK();
    pcVar32[0x49] = '\x01';
    UNLOCK();
    __th = (list *)(pfVar14->kvs_config).custom_cmp;
    *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x11460b;
    pthread_join((pthread_t)__th,ppvVar17 + 1);
    pfVar33 = *(fdb_file_handle **)pcVar32;
    *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114613;
    fVar7 = fdb_close(pfVar33);
    pp_Var31 = (fdb_custom_cmp_variable *)0xfffffffffffffff8;
    if (fVar7 == FDB_RESULT_SUCCESS) {
      *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114623;
      free(pfVar14);
      *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x11462b;
      free(pcVar32);
      *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114633;
      free(ppvVar17);
      *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114638;
      fdb_shutdown();
      pcVar32 = "%s PASSED\n";
      if (multi_thread_fhandle_share(void*)::__test_pass != '\0') {
        pcVar32 = "%s FAILED\n";
      }
      *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x114669;
      fprintf(_stderr,pcVar32,"multi thread file handle share test");
      return;
    }
  }
  else {
LAB_001146a0:
    *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x1146a5;
    multi_thread_fhandle_share();
    pp_Var26 = pp_Var25;
LAB_001146a5:
    *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x1146aa;
    multi_thread_fhandle_share();
    pp_Var27 = pp_Var26;
LAB_001146aa:
    *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x1146af;
    multi_thread_fhandle_share();
    pp_Var28 = pp_Var27;
LAB_001146af:
    *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x1146b4;
    multi_thread_fhandle_share();
    pp_Var29 = pp_Var28;
LAB_001146b4:
    *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x1146b9;
    multi_thread_fhandle_share();
    pp_Var30 = pp_Var29;
LAB_001146b9:
    *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x1146be;
    multi_thread_fhandle_share();
    pp_Var31 = pp_Var30;
LAB_001146be:
    *(undefined8 *)(pfVar24 + 0xfffffffffffffff0) = 0x1146c3;
    multi_thread_fhandle_share();
  }
  *(code **)(pfVar24 + 0xfffffffffffffff0) = incomplete_block_test;
  multi_thread_fhandle_share();
  *(fdb_custom_cmp_variable **)(pfVar24 + 0xfffffffffffffff0) = pp_Var31;
  *(void ***)((long)(pfVar24 + 0xffffffffffffffef) + 0x10) = ppvVar17;
  *(char **)((long)(pfVar24 + 0xffffffffffffffef) + 8) = pcVar32;
  *(code **)(pfVar24 + 0xffffffffffffffef) = pcVar36;
  *(fdb_config **)((long)(pfVar24 + 0xffffffffffffffee) + 0x10) = fconfig_01;
  *(fdb_kvs_handle **)((long)(pfVar24 + 0xffffffffffffffee) + 8) = pfVar14;
  *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x1146e8;
  gettimeofday((timeval *)((long)(pfVar24 + 0xffffffffffffffc2) + 8),(__timezone_ptr_t)0x0);
  *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x1146ed;
  memleak_start();
  *(void **)((long)(pfVar24 + 0xffffffffffffffc0) + 0x10) = (void *)0x0;
  *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x1146fe;
  system("rm -rf  dummy* > errorlog.txt");
  *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x11470e;
  fdb_get_default_config();
  pfVar15 = (fdb_doc *)(pfVar24 + 0xffffffffffffffc3);
  *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x11471b;
  fdb_get_default_kvs_config();
  *(fdb_custom_cmp_variable *)((long)(pfVar24 + 0xffffffffffffffe4) + 8) =
       (fdb_custom_cmp_variable)0x0;
  *(void **)((long)(pfVar24 + 0xffffffffffffffe4) + 0x10) = (void *)0x400;
  *(undefined4 *)((long)(pfVar24 + 0xffffffffffffffe5) + 0xc) = 1;
  *(undefined1 *)((long)(pfVar24 + 0xffffffffffffffe5) + 0x17) = 0;
  pfVar18 = pfVar24 + 0xffffffffffffffc2;
  *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x114749;
  fdb_open((fdb_file_handle **)pfVar18,"./dummy1",(fdb_config *)(pfVar24 + 0xffffffffffffffe4));
  pfVar33 = *(fdb_file_handle **)pfVar18;
  pfVar22 = pfVar24 + 0xffffffffffffffc1;
  *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x11475c;
  fdb_kvs_open_default(pfVar33,(fdb_kvs_handle **)pfVar22,(fdb_kvs_config *)pfVar15);
  pfVar14 = *(fdb_kvs_handle **)pfVar22;
  *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x114772;
  fVar7 = fdb_set_log_callback(pfVar14,logCallbackFunc,"incomplete_block_test");
  if (fVar7 == FDB_RESULT_SUCCESS) {
    fconfig_01 = (fdb_config *)0x0;
    uVar9 = 0;
    do {
      *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x11479a;
      sprintf((char *)((long)(pfVar24 + 0xffffffffffffffd9) + 8U),"key%d",uVar9 & 0xffffffff);
      *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x1147b2;
      sprintf((char *)((long)(pfVar24 + 0xffffffffffffffce) + 0x10),"meta%d",uVar9 & 0xffffffff);
      *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x1147c7;
      sprintf(&pfVar24[0xffffffffffffffc4].create_if_missing,"body%d",uVar9 & 0xffffffff);
      pfVar18 = (fdb_kvs_config *)((long)pfVar24 + (long)fconfig_01 + -0x5e0);
      *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x1147d7;
      sVar10 = strlen((char *)((long)(pfVar24 + 0xffffffffffffffd9) + 8U));
      pp_Var31 = (fdb_custom_cmp_variable *)((long)(pfVar24 + 0xffffffffffffffce) + 0x10);
      *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x1147ea;
      pfVar15 = (fdb_doc *)strlen((char *)pp_Var31);
      *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x1147f7;
      sVar11 = strlen(&pfVar24[0xffffffffffffffc4].create_if_missing);
      *(size_t *)(pfVar24 + 0xffffffffffffffc0) = sVar11;
      *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x114819;
      fdb_doc_create((fdb_doc **)pfVar18,
                     (fdb_custom_cmp_variable *)((long)(pfVar24 + 0xffffffffffffffd9) + 8),sVar10,
                     pp_Var31,(size_t)pfVar15,pfVar24 + 0xffffffffffffffc4,
                     *(size_t *)(pfVar24 + 0xffffffffffffffc0));
      pfVar14 = *(fdb_kvs_handle **)(pfVar24 + 0xffffffffffffffc1);
      doc = *(fdb_doc **)((long)pfVar24 + (uVar9 - 0xbc) * 8);
      *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x114828;
      fdb_set(pfVar14,doc);
      uVar9 = uVar9 + 1;
      fconfig_01 = (fdb_config *)((long)fconfig_01 + 8);
    } while (uVar9 == 1);
    pcVar36 = (code *)0x0;
    pfVar22 = (fdb_kvs_config *)((long)(pfVar24 + 0xffffffffffffffc0) + 0x10);
    while( true ) {
      lVar37 = *(long *)((long)pfVar24 + ((long)pcVar36 + -0xbc) * 8);
      keylen = *(size_t *)lVar37;
      pvVar20 = *(void **)(lVar37 + 0x20);
      *(undefined8 *)(pfVar24 + 0xffffffffffffffc0) = 0;
      pfVar19 = (fdb_kvs_config *)0x0;
      *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x114865;
      fdb_doc_create((fdb_doc **)pfVar22,pvVar20,keylen,(void *)0x0,0,(void *)0x0,
                     *(size_t *)(pfVar24 + 0xffffffffffffffc0));
      pfVar14 = *(fdb_kvs_handle **)(pfVar24 + 0xffffffffffffffc1);
      *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x114874;
      fVar7 = fdb_get(pfVar14,*(fdb_doc **)((long)(pfVar24 + 0xffffffffffffffc0) + 0x10));
      if (fVar7 != FDB_RESULT_SUCCESS) break;
      pfVar15 = *(fdb_doc **)((long)(pfVar24 + 0xffffffffffffffc0) + 0x10);
      sVar10 = pfVar15->metalen;
      pfVar18 = (fdb_kvs_config *)pfVar15->meta;
      pp_Var31 = *(fdb_custom_cmp_variable **)((long)pfVar24 + ((long)pcVar36 + -0xbc) * 8);
      fconfig_01 = (fdb_config *)pp_Var31[7];
      *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x11489d;
      iVar8 = bcmp(pfVar18,fconfig_01,sVar10);
      if (iVar8 != 0) goto LAB_0011495d;
      sVar10 = pfVar15->bodylen;
      pfVar18 = (fdb_kvs_config *)pfVar15->body;
      fconfig_01 = (fdb_config *)pp_Var31[8];
      *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x1148bc;
      iVar8 = bcmp(pfVar18,fconfig_01,sVar10);
      if (iVar8 != 0) goto LAB_00114968;
      *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x1148cc;
      fdb_doc_free(pfVar15);
      *(void **)((long)(pfVar24 + 0xffffffffffffffc0) + 0x10) = (void *)0x0;
      pcVar36 = (code *)((long)pcVar36 + 1);
      if ((void **)pcVar36 != (void **)0x1) {
        pfVar14 = *(fdb_kvs_handle **)(pfVar24 + 0xffffffffffffffc1);
        *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x1148ec;
        fdb_kvs_close(pfVar14);
        pfVar33 = *(fdb_file_handle **)(pfVar24 + 0xffffffffffffffc2);
        *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x1148f6;
        fdb_close(pfVar33);
        lVar37 = 0;
        do {
          pfVar15 = *(fdb_doc **)((long)pfVar24 + (lVar37 + -0xbc) * 8);
          *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x114902;
          fdb_doc_free(pfVar15);
          lVar37 = lVar37 + 1;
        } while (lVar37 == 1);
        *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x114910;
        fdb_shutdown();
        *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x114915;
        memleak_end();
        pcVar32 = "%s PASSED\n";
        if (incomplete_block_test()::__test_pass != '\0') {
          pcVar32 = "%s FAILED\n";
        }
        *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x114946;
        fprintf(_stderr,pcVar32,"incomplete block test");
        return;
      }
    }
    *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x11495d;
    incomplete_block_test();
LAB_0011495d:
    *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x114968;
    incomplete_block_test();
LAB_00114968:
    *(undefined8 *)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = 0x114973;
    incomplete_block_test();
  }
  *(code **)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = custom_compare_primitive_test;
  incomplete_block_test();
  *(fdb_custom_cmp_variable **)((long)(pfVar24 + 0xffffffffffffffbf) + 0x10) = pp_Var31;
  *(fdb_kvs_config **)((long)(pfVar24 + 0xffffffffffffffbf) + 8) = pfVar18;
  *(fdb_doc **)(pfVar24 + 0xffffffffffffffbf) = pfVar15;
  *(code **)((long)(pfVar24 + 0xffffffffffffffbe) + 0x10) = pcVar36;
  *(fdb_config **)((long)(pfVar24 + 0xffffffffffffffbe) + 8) = fconfig_01;
  *(fdb_kvs_config **)(pfVar24 + 0xffffffffffffffbe) = pfVar22;
  uVar9 = 0;
  *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114997;
  gettimeofday((timeval *)((long)(pfVar24 + 0xffffffffffffff98) + 0x10),(__timezone_ptr_t)0x0);
  *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x11499c;
  memleak_start();
  *(undefined8 *)(pfVar24 + 0xffffffffffffff97) = 0;
  *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x1149ad;
  system("rm -rf  dummy* > errorlog.txt");
  *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x1149bd;
  fdb_get_default_config();
  *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x1149ca;
  fdb_get_default_kvs_config();
  *(undefined8 *)(pfVar24 + 0xffffffffffffffa9) = 0;
  *(fdb_custom_cmp_variable *)((long)(pfVar24 + 0xffffffffffffffa9) + 8) =
       (fdb_custom_cmp_variable)0x400;
  *(undefined4 *)((long)(pfVar24 + 0xffffffffffffffaa) + 4) = 1;
  *(undefined1 *)((long)(pfVar24 + 0xffffffffffffffaa) + 0xf) = 0;
  *(undefined1 *)((long)(pfVar24 + 0xffffffffffffffab) + 8) = 1;
  *(code **)((long)(pfVar24 + 0xffffffffffffff99) + 0x10) = _cmp_double;
  *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114a0a;
  fdb_open((fdb_file_handle **)((long)(pfVar24 + 0xffffffffffffff98) + 8U),"./dummy1",
           (fdb_config *)((long)(pfVar24 + 0xffffffffffffffa8) + 0x10));
  pfVar33 = *(fdb_file_handle **)((long)(pfVar24 + 0xffffffffffffff98) + 8U);
  *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114a1e;
  fdb_kvs_open_default
            (pfVar33,(fdb_kvs_handle **)(pfVar24 + 0xffffffffffffff98),
             (fdb_kvs_config *)((long)(pfVar24 + 0xffffffffffffff99) + 8));
  pcVar36 = logCallbackFunc;
  *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114a34;
  fVar7 = fdb_set_log_callback
                    (*(fdb_kvs_handle **)(pfVar24 + 0xffffffffffffff98),logCallbackFunc,
                     "custom_compare_primitive_test");
  if (fVar7 == FDB_RESULT_SUCCESS) {
    pp_Var31 = (fdb_custom_cmp_variable *)((long)(pfVar24 + 0xffffffffffffff9a) + 8);
    pfVar19 = pfVar24 + 0xffffffffffffffb3;
    lVar37 = 0;
    do {
      pvVar20 = (void *)(10000.0 / (double)(int)lVar37);
      *(void **)((long)(pfVar24 + 0xffffffffffffff9d) + 0x10) = pvVar20;
      *(void **)((long)(pfVar24 + 0xffffffffffffff96) + 0x10) = pvVar20;
      *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114a8f;
      sprintf(&pfVar19->create_if_missing,"value: %d, %f",(int)pvVar20,uVar9);
      *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114a97;
      sVar10 = strlen(&pfVar19->create_if_missing);
      *(size_t *)((long)(pfVar24 + 0xffffffffffffff96) + 8) = sVar10 + 1;
      *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114ab6;
      fdb_doc_create((fdb_doc **)pp_Var31,(void **)((long)(pfVar24 + 0xffffffffffffff9d) + 0x10),8,
                     (void *)0x0,0,pfVar19,*(size_t *)((long)(pfVar24 + 0xffffffffffffff96) + 8));
      pfVar15 = (fdb_doc *)*pp_Var31;
      *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114ac3;
      fdb_set(*(fdb_kvs_handle **)(pfVar24 + 0xffffffffffffff98),pfVar15);
      lVar37 = lVar37 + 0xb;
      uVar9 = (ulong)((int)uVar9 + 1);
      pp_Var31 = pp_Var31 + 1;
    } while (lVar37 != 0x6e);
    *(void **)((long)(pfVar24 + 0xffffffffffffff97) + 0x10U) =
         *(void **)((long)(pfVar24 + 0xffffffffffffff96) + 0x10);
    pfVar14 = *(fdb_kvs_handle **)(pfVar24 + 0xffffffffffffff98);
    *(undefined4 *)((long)(pfVar24 + 0xffffffffffffff96) + 8) = 0;
    pfVar19 = (fdb_kvs_config *)0x0;
    *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114b02;
    fdb_iterator_init(pfVar14,(fdb_iterator **)((long)(pfVar24 + 0xffffffffffffff97) + 8),
                      (void *)0x0,0,(void *)0x0,0,
                      *(fdb_iterator_opt_t *)((long)(pfVar24 + 0xffffffffffffff96) + 8));
    uVar38 = 0;
    uVar39 = 0xbff00000;
    do {
      *(void **)((long)(pfVar24 + 0xffffffffffffff96) + 0x10) = (void *)CONCAT44(uVar39,uVar38);
      pfVar4 = *(fdb_iterator **)((long)(pfVar24 + 0xffffffffffffff97) + 8);
      *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114b22;
      pcVar36 = (code *)(pfVar24 + 0xffffffffffffff97);
      fVar7 = fdb_iterator_get(pfVar4,(fdb_doc **)(pfVar24 + 0xffffffffffffff97));
      if (fVar7 != FDB_RESULT_SUCCESS) {
LAB_00114d7b:
        *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114d80;
        custom_compare_primitive_test();
        goto LAB_00114d80;
      }
      sVar10 = *(size_t *)*(long *)(pfVar24 + 0xffffffffffffff97);
      pcVar36 = *(code **)(*(long *)(pfVar24 + 0xffffffffffffff97) + 0x20);
      *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114b3e;
      memcpy((void **)((long)(pfVar24 + 0xffffffffffffff97) + 0x10U),pcVar36,sVar10);
      pvVar20 = *(void **)((long)(pfVar24 + 0xffffffffffffff97) + 0x10);
      if ((double)pvVar20 < (double)*(void **)((long)(pfVar24 + 0xffffffffffffff96) + 0x10U) ||
          (double)pvVar20 == (double)*(void **)((long)(pfVar24 + 0xffffffffffffff96) + 0x10U)) {
        *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114d7b;
        custom_compare_primitive_test();
        goto LAB_00114d7b;
      }
      pfVar15 = *(fdb_doc **)(pfVar24 + 0xffffffffffffff97);
      *(void **)((long)(pfVar24 + 0xffffffffffffff96) + 0x10) = pvVar20;
      *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114b60;
      fdb_doc_free(pfVar15);
      *(undefined8 *)(pfVar24 + 0xffffffffffffff97) = 0;
      pfVar4 = *(fdb_iterator **)((long)(pfVar24 + 0xffffffffffffff97) + 8);
      *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114b73;
      fVar7 = fdb_iterator_next(pfVar4);
      uVar38 = SUB84(*(void **)((long)(pfVar24 + 0xffffffffffffff96) + 0x10),0);
      uVar39 = (undefined4)((ulong)*(void **)((long)(pfVar24 + 0xffffffffffffff96) + 0x10) >> 0x20);
    } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
    pfVar4 = *(fdb_iterator **)((long)(pfVar24 + 0xffffffffffffff97) + 8U);
    *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114b8b;
    fdb_iterator_close(pfVar4);
    pfVar33 = *(fdb_file_handle **)((long)(pfVar24 + 0xffffffffffffff98) + 8);
    *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114b9a;
    fdb_commit(pfVar33,'\x01');
    pfVar14 = *(fdb_kvs_handle **)(pfVar24 + 0xffffffffffffff98);
    *(undefined4 *)((long)(pfVar24 + 0xffffffffffffff96) + 8) = 0;
    pfVar19 = (fdb_kvs_config *)0x0;
    *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114bb8;
    fdb_iterator_init(pfVar14,(fdb_iterator **)((long)(pfVar24 + 0xffffffffffffff97) + 8U),
                      (void *)0x0,0,(void *)0x0,0,
                      *(fdb_iterator_opt_t *)((long)(pfVar24 + 0xffffffffffffff96) + 8));
    uVar38 = 0;
    uVar39 = 0xbff00000;
    do {
      *(void **)((long)(pfVar24 + 0xffffffffffffff96) + 0x10) = (void *)CONCAT44(uVar39,uVar38);
      pfVar4 = *(fdb_iterator **)((long)(pfVar24 + 0xffffffffffffff97) + 8);
      *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114bdd;
      pcVar36 = (code *)(pfVar24 + 0xffffffffffffff97);
      fVar7 = fdb_iterator_get(pfVar4,(fdb_doc **)(pfVar24 + 0xffffffffffffff97));
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00114d85;
      sVar10 = *(size_t *)*(long *)(pfVar24 + 0xffffffffffffff97);
      pcVar36 = *(code **)(*(long *)(pfVar24 + 0xffffffffffffff97) + 0x20);
      *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114bf9;
      memcpy((void **)((long)(pfVar24 + 0xffffffffffffff97) + 0x10),pcVar36,sVar10);
      pvVar20 = *(void **)((long)(pfVar24 + 0xffffffffffffff97) + 0x10);
      if ((double)pvVar20 < (double)*(void **)((long)(pfVar24 + 0xffffffffffffff96) + 0x10U) ||
          (double)pvVar20 == (double)*(void **)((long)(pfVar24 + 0xffffffffffffff96) + 0x10U))
      goto LAB_00114d80;
      pfVar15 = *(fdb_doc **)(pfVar24 + 0xffffffffffffff97);
      *(void **)((long)(pfVar24 + 0xffffffffffffff96) + 0x10) = pvVar20;
      *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114c1b;
      fdb_doc_free(pfVar15);
      *(undefined8 *)(pfVar24 + 0xffffffffffffff97) = 0;
      pfVar4 = *(fdb_iterator **)((long)(pfVar24 + 0xffffffffffffff97) + 8);
      *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114c2e;
      fVar7 = fdb_iterator_next(pfVar4);
      uVar38 = SUB84(*(void **)((long)(pfVar24 + 0xffffffffffffff96) + 0x10),0);
      uVar39 = (undefined4)((ulong)*(void **)((long)(pfVar24 + 0xffffffffffffff96) + 0x10) >> 0x20);
    } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
    pfVar4 = *(fdb_iterator **)((long)(pfVar24 + 0xffffffffffffff97) + 8U);
    *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114c46;
    fdb_iterator_close(pfVar4);
    pfVar33 = *(fdb_file_handle **)((long)(pfVar24 + 0xffffffffffffff98) + 8);
    *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114c57;
    fdb_compact(pfVar33,"./dummy2");
    pfVar14 = *(fdb_kvs_handle **)(pfVar24 + 0xffffffffffffff98);
    *(undefined4 *)((long)(pfVar24 + 0xffffffffffffff96) + 8) = 0;
    pfVar19 = (fdb_kvs_config *)0x0;
    *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114c75;
    fdb_iterator_init(pfVar14,(fdb_iterator **)((long)(pfVar24 + 0xffffffffffffff97) + 8U),
                      (void *)0x0,0,(void *)0x0,0,
                      *(fdb_iterator_opt_t *)((long)(pfVar24 + 0xffffffffffffff96) + 8));
    uVar38 = 0;
    uVar39 = 0xbff00000;
    while( true ) {
      *(void **)((long)(pfVar24 + 0xffffffffffffff96) + 0x10) = (void *)CONCAT44(uVar39,uVar38);
      pfVar4 = *(fdb_iterator **)((long)(pfVar24 + 0xffffffffffffff97) + 8);
      *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114c9a;
      pcVar36 = (code *)(pfVar24 + 0xffffffffffffff97);
      fVar7 = fdb_iterator_get(pfVar4,(fdb_doc **)(pfVar24 + 0xffffffffffffff97));
      if (fVar7 != FDB_RESULT_SUCCESS) break;
      sVar10 = *(size_t *)*(long *)(pfVar24 + 0xffffffffffffff97);
      pcVar36 = *(code **)(*(long *)(pfVar24 + 0xffffffffffffff97) + 0x20);
      *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114cb6;
      memcpy((void **)((long)(pfVar24 + 0xffffffffffffff97) + 0x10),pcVar36,sVar10);
      pvVar20 = *(void **)((long)(pfVar24 + 0xffffffffffffff97) + 0x10);
      if ((double)pvVar20 < (double)*(void **)((long)(pfVar24 + 0xffffffffffffff96) + 0x10U) ||
          (double)pvVar20 == (double)*(void **)((long)(pfVar24 + 0xffffffffffffff96) + 0x10U))
      goto LAB_00114d8a;
      pfVar15 = *(fdb_doc **)(pfVar24 + 0xffffffffffffff97);
      *(void **)((long)(pfVar24 + 0xffffffffffffff96) + 0x10) = pvVar20;
      *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114cd8;
      fdb_doc_free(pfVar15);
      *(undefined8 *)(pfVar24 + 0xffffffffffffff97) = 0;
      pfVar4 = *(fdb_iterator **)((long)(pfVar24 + 0xffffffffffffff97) + 8);
      *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114ceb;
      fVar7 = fdb_iterator_next(pfVar4);
      uVar38 = SUB84(*(void **)((long)(pfVar24 + 0xffffffffffffff96) + 0x10),0);
      uVar39 = (undefined4)((ulong)*(void **)((long)(pfVar24 + 0xffffffffffffff96) + 0x10) >> 0x20);
      if (fVar7 == FDB_RESULT_ITERATOR_FAIL) {
        pfVar4 = *(fdb_iterator **)((long)(pfVar24 + 0xffffffffffffff97) + 8);
        *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114d00;
        fdb_iterator_close(pfVar4);
        *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114d0a;
        fdb_kvs_close(*(fdb_kvs_handle **)(pfVar24 + 0xffffffffffffff98));
        pfVar33 = *(fdb_file_handle **)((long)(pfVar24 + 0xffffffffffffff98) + 8);
        *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114d14;
        fdb_close(pfVar33);
        lVar37 = 0;
        do {
          pfVar15 = *(fdb_doc **)((long)pfVar24 + (lVar37 + -0x131) * 8);
          *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114d20;
          fdb_doc_free(pfVar15);
          lVar37 = lVar37 + 1;
        } while (lVar37 != 10);
        *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114d2e;
        fdb_shutdown();
        *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114d33;
        memleak_end();
        pcVar32 = "%s PASSED\n";
        if (custom_compare_primitive_test()::__test_pass != '\0') {
          pcVar32 = "%s FAILED\n";
        }
        *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114d64;
        fprintf(_stderr,pcVar32,"custom compare function for primitive key test");
        return;
      }
    }
LAB_00114d8f:
    *(undefined8 *)(pfVar24 + 0xffffffffffffff96) = 0x114d94;
    custom_compare_primitive_test();
  }
  *(code **)(pfVar24 + 0xffffffffffffff96) = _cmp_double;
  custom_compare_primitive_test();
  if (((fdb_kvs_config *)pcVar36 != (fdb_kvs_config *)0x0) && (pfVar19 == (fdb_kvs_config *)0x0)) {
    return;
  }
  return;
}

Assistant:

void multi_thread_test(
    size_t ndocs, size_t wal_threshold, size_t time_sec,
    size_t nbatch, size_t compact_term, size_t nwriters, size_t nreaders)
{
    TEST_INIT();

    size_t nwrites, nreads;
    int i, r;
    int n = nwriters + nreaders;;
    thread_t *tid = alca(thread_t, n);
    void **thread_ret = alca(void *, n);
    struct work_thread_args *args = alca(struct work_thread_args, n);
    struct timeval ts_begin, ts_cur, ts_gap;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, ndocs);
    fdb_status status;
    fdb_kvs_info kvs_info;

    int filename_count = 1;
    int n_opened = 0;
    spin_t filename_count_lock;
    spin_init(&filename_count_lock);

    char keybuf[1024], metabuf[1024], bodybuf[1024], temp[1024];

    // remove previous dummy files
    r = system(SHELL_DEL" " FILENAME "* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    memleak_start();

    // initial population ===
    DBG("Initialize..\n");

    // open db
    sprintf(temp, FILENAME"%d", filename_count);
    fdb_open(&dbfile, temp, &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "multi_thread_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    gettimeofday(&ts_begin, NULL);

    // insert documents
    for (i = 0; (size_t)i < ndocs; ++i){
        _set_random_string_smallabt(temp, KSIZE - (IDX_DIGIT+1));
        sprintf(keybuf, "k%0" IDX_DIGIT_STR "d%s", i, temp);

        sprintf(metabuf, "m%0" IDX_DIGIT_STR "d", i);

        _set_random_string_smallabt(temp, VSIZE-(IDX_DIGIT*2+1));
        sprintf(bodybuf, "b%0" IDX_DIGIT_STR "d%0" IDX_DIGIT_STR "d%s", i, 0, temp);

        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    gettimeofday(&ts_cur, NULL);
    ts_gap = _utime_gap(ts_begin, ts_cur);
    //DBG("%d.%09d seconds elapsed\n", (int)ts_gap.tv_sec, (int)ts_gap.tv_nsec);

    fdb_kvs_close(db);
    fdb_close(dbfile);
    // end of population ===

    // drop OS's page cache
    //r = system("free && sync && echo 3 > /proc/sys/vm/drop_caches && free");

    // create workers
    for (i=0;i<n;++i){
        args[i].tid = i;
        args[i].nthreads = n;
        args[i].writer = (((size_t)i<nwriters)?(1):(0));
        args[i].ndocs = ndocs;
        args[i].doc = doc;
        args[i].time_sec = time_sec;
        args[i].nbatch = nbatch;
        args[i].compact_term = compact_term;
        args[i].n_opened = &n_opened;
        args[i].filename_count = &filename_count;
        args[i].filename_count_lock = &filename_count_lock;
        args[i].config = &fconfig;
        args[i].kvs_config = &kvs_config;
        thread_create(&tid[i], _worker_thread, &args[i]);
    }

    printf("wait for %d seconds..\n", (int)time_sec);

    // wait for thread termination
    for (i=0;i<n;++i){
        thread_join(tid[i], &thread_ret[i]);
    }

    // free all documents
    for (i=0;(size_t)i<ndocs;++i){
        fdb_doc_free(doc[i]);
    }

    nwrites = nreads = 0;
    for (i=0;i<n;++i){
        if (args[i].writer) {
            nwrites += args[i].nops;
        } else {
            nreads += args[i].nops;
        }
    }
    printf("read: %.1f ops/sec\n", (double)nreads/time_sec);
    printf("write: %.1f ops/sec\n", (double)nwrites/time_sec);

    // check sequence number
    sprintf(temp, FILENAME"%d", filename_count);
    fdb_open(&dbfile, temp, &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == ndocs+nwrites);
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // shutdown
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("multi thread test");
}